

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O3

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                 (DB *db,LIST *params,IfcRepresentationMap *in)

{
  pointer psVar1;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_> local_71;
  string local_70;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> local_50 [3];
  
  psVar1 = (params->members).
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1)) {
    local_70._M_dataplus._M_p =
         (pointer)(psVar1->
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
    local_70._M_string_length =
         (size_type)
         (psVar1->
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->
             _M_use_count + 1;
      }
    }
    *(pointer *)
     &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>).field_0x10 =
         local_70._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>).
                field_0x18,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length)
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[1].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_50[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[1].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_50[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>::
    operator()(&local_71,
               (Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation> *)
               &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>).
                field_0x20,local_50,db);
    if (local_50[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50[0].
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return 2;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"expected 2 arguments to IfcRepresentationMap","");
  TypeError::TypeError(this,&local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcSphere>(const DB& db, const LIST& params, IfcSphere* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcCsgPrimitive3D*>(in));
// this data structure is not used yet, so there is no code generated to fill its members
	return base;
}